

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_flush_page_by_mmuidx_async_0(CPUState *cpu,target_ulong_conflict addr,uint16_t idxmap)

{
  CPUArchState_conflict28 *env_00;
  int local_24;
  int mmu_idx;
  CPUArchState_conflict28 *env;
  uint16_t idxmap_local;
  target_ulong_conflict addr_local;
  CPUState *cpu_local;
  
  env_00 = (CPUArchState_conflict28 *)cpu->env_ptr;
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    if (((int)(uint)idxmap >> ((byte)local_24 & 0x1f) & 1U) != 0) {
      tlb_flush_page_locked(env_00,local_24,addr);
    }
  }
  tb_flush_jmp_cache_tricore(cpu,addr);
  return;
}

Assistant:

static void tlb_flush_page_by_mmuidx_async_0(CPUState *cpu,
                                             target_ulong addr,
                                             uint16_t idxmap)
{
    CPUArchState *env = cpu->env_ptr;
    int mmu_idx;

    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        if ((idxmap >> mmu_idx) & 1) {
            tlb_flush_page_locked(env, mmu_idx, addr);
        }
    }

    tb_flush_jmp_cache(cpu, addr);
}